

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreeview.cpp
# Opt level: O2

void __thiscall QTreeView::expandRecursively(QTreeView *this,QModelIndex *index,int depth)

{
  QTreeViewPrivate *this_00;
  QAbstractItemModel *pQVar1;
  int iVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  long in_FS_OFFSET;
  QModelIndex local_b8;
  QArrayDataPointer<std::pair<QModelIndex,_int>_> local_98;
  pair<QModelIndex,_int> local_78;
  undefined1 *local_58;
  undefined1 *puStack_50;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_48;
  undefined1 *puStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (-2 < depth) {
    this_00 = *(QTreeViewPrivate **)
               &(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.super_QWidget
                .field_0x8;
    QAbstractItemViewPrivate::doDelayedItemsLayout(&this_00->super_QAbstractItemViewPrivate,0);
    expand(this,index);
    if (depth != 0) {
      local_98.d = (Data *)0x0;
      local_98.ptr = (pair<QModelIndex,_int> *)0x0;
      local_98.size = 0;
      local_48.ptr = (index->m).ptr;
      local_58 = *(undefined1 **)index;
      puStack_50 = (undefined1 *)index->i;
      puStack_40 = (undefined1 *)((ulong)puStack_40 & 0xffffffff00000000);
      QList<std::pair<QModelIndex,int>>::emplaceBack<std::pair<QModelIndex,int>const&>
                ((QList<std::pair<QModelIndex,int>> *)&local_98,(pair<QModelIndex,_int> *)&local_58)
      ;
LAB_005444a3:
      if (local_98.size != 0) {
        local_48.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
        puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
        local_58 = &DAT_aaaaaaaaaaaaaaaa;
        puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
        QList<std::pair<QModelIndex,_int>_>::takeLast
                  ((pair<QModelIndex,_int> *)&local_58,
                   (QList<std::pair<QModelIndex,_int>_> *)&local_98);
        iVar2 = (int)puStack_40;
        pQVar1 = (this_00->super_QAbstractItemViewPrivate).model;
        iVar4 = (**(code **)(*(long *)pQVar1 + 0x78))(pQVar1,(pair<QModelIndex,_int> *)&local_58);
        iVar5 = 0;
        if (iVar4 < 1) {
          iVar4 = iVar5;
        }
        for (; iVar4 != iVar5; iVar5 = iVar5 + 1) {
          local_b8.m.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
          local_b8.r = -0x55555556;
          local_b8.c = -0x55555556;
          local_b8.i._0_4_ = 0xaaaaaaaa;
          local_b8.i._4_4_ = 0xaaaaaaaa;
          pQVar1 = (this_00->super_QAbstractItemViewPrivate).model;
          (**(code **)(*(long *)pQVar1 + 0x60))
                    (&local_b8,pQVar1,iVar5,0,(pair<QModelIndex,_int> *)&local_58);
          if (((local_b8.r < 0) || (local_b8.c < 0)) ||
             (local_b8.m.ptr != (this_00->super_QAbstractItemViewPrivate).model)) break;
          if (iVar2 + 1 < depth || depth == -1) {
            local_78.first.m.ptr = local_b8.m.ptr;
            local_78.first.c = local_b8.c;
            local_78.first.r = local_b8.r;
            local_78.first.i = CONCAT44(local_b8.i._4_4_,(undefined4)local_b8.i);
            local_78.second = iVar2 + 1;
            QList<std::pair<QModelIndex,int>>::emplaceBack<std::pair<QModelIndex,int>const&>
                      ((QList<std::pair<QModelIndex,int>> *)&local_98,&local_78);
          }
          bVar3 = QTreeViewPrivate::isIndexExpanded(this_00,&local_b8);
          if (!bVar3) {
            QPersistentModelIndex::QPersistentModelIndex
                      ((QPersistentModelIndex *)&local_78,&local_b8);
            bVar3 = QTreeViewPrivate::storeExpanded(this_00,(QPersistentModelIndex *)&local_78);
            QPersistentModelIndex::~QPersistentModelIndex((QPersistentModelIndex *)&local_78);
            if (bVar3) {
              expanded(this,&local_b8);
            }
          }
        }
        goto LAB_005444a3;
      }
      QArrayDataPointer<std::pair<QModelIndex,_int>_>::~QArrayDataPointer(&local_98);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTreeView::expandRecursively(const QModelIndex &index, int depth)
{
    Q_D(QTreeView);

    if (depth < -1)
        return;
    // do layouting only once after expanding is done
    d->doDelayedItemsLayout();
    expand(index);
    if (depth == 0)
        return;
    QStack<std::pair<QModelIndex, int>> parents;
    parents.push({index, 0});
    while (!parents.isEmpty()) {
        const std::pair<QModelIndex, int> elem = parents.pop();
        const QModelIndex &parent = elem.first;
        const int curDepth = elem.second;
        const int rowCount = d->model->rowCount(parent);
        for (int row = 0; row < rowCount; ++row) {
            const QModelIndex child = d->model->index(row, 0, parent);
            if (!d->isIndexValid(child))
                break;
            if (depth == -1 || curDepth + 1 < depth)
                parents.push({child, curDepth + 1});
            if (d->isIndexExpanded(child))
                continue;
            if (d->storeExpanded(child))
                emit expanded(child);
        }
    }
}